

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeArray * __thiscall
ExpressionContext::GetArrayType(ExpressionContext *this,TypeBase *type,longlong length)

{
  long lVar1;
  int iVar2;
  IntrusiveList<TypeHandle> *pIVar3;
  undefined4 extraout_var;
  TypeHandle *pTVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  InplaceStr name;
  TypeArray *local_30;
  TypeArray *pTVar4;
  undefined4 extraout_var_00;
  
  if (this->typeVoid == type) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a1,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  if (this->typeAuto == type) {
    __assert_fail("type != typeAuto",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6a4,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
  }
  if (type != (TypeBase *)0x0) {
    uVar7 = type->typeID;
    if (uVar7 == 0x18) {
      if ((*(char *)&type[3]._vptr_TypeBase != '\x01') ||
         (*(char *)((long)&type[3]._vptr_TypeBase + 2) == '\x01')) {
        __assert_fail("typeClass->completed && !typeClass->hasFinalizer",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x6ae,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
      }
    }
    else {
      if (uVar7 - 0x1a < 3) {
        __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x6a7,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
      }
      if (uVar7 == 0) {
        __assert_fail("!isType<TypeError>(type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x6a8,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
      }
    }
  }
  pIVar3 = &type->arrayTypes;
  while( true ) {
    pTVar5 = pIVar3->head;
    if (pTVar5 == (TypeHandle *)0x0) {
      if (type->size < 0x10000) {
        iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x70);
        pTVar4 = (TypeArray *)CONCAT44(extraout_var,iVar2);
        name = GetArrayTypeName(this,type,length);
        TypeArray::TypeArray(pTVar4,name,type,length);
        uVar7 = type->alignment;
        (pTVar4->super_TypeBase).alignment = uVar7;
        uVar8 = 4;
        if (4 < uVar7) {
          uVar8 = (ulong)uVar7;
        }
        lVar1 = (pTVar4->super_TypeBase).size;
        lVar6 = lVar1 % (long)uVar8;
        if (lVar6 != 0) {
          uVar7 = (int)uVar8 - (int)lVar6;
          (pTVar4->super_TypeBase).padding = uVar7;
          (pTVar4->super_TypeBase).size = (ulong)uVar7 + lVar1;
        }
        iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
        pTVar5 = (TypeHandle *)CONCAT44(extraout_var_00,iVar2);
        pTVar5->type = (TypeBase *)pTVar4;
        pTVar5->next = (TypeHandle *)0x0;
        pTVar5->listed = false;
        IntrusiveList<TypeHandle>::push_back(&type->arrayTypes,pTVar5);
        local_30 = pTVar4;
        SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_30);
        return pTVar4;
      }
      __assert_fail("type->size < 64 * 1024",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6ba,"TypeArray *ExpressionContext::GetArrayType(TypeBase *, long long)");
    }
    pTVar4 = (TypeArray *)pTVar5->type;
    if (((pTVar4 != (TypeArray *)0x0) && ((pTVar4->super_TypeBase).typeID == 0x13)) &&
       (pTVar4->length == length)) break;
    pIVar3 = (IntrusiveList<TypeHandle> *)&pTVar5->next;
  }
  return pTVar4;
}

Assistant:

TypeArray* ExpressionContext::GetArrayType(TypeBase* type, long long length)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't have array of auto
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		(void)typeClass;

		assert(typeClass->completed && !typeClass->hasFinalizer);
	}

	for(TypeHandle *curr = type->arrayTypes.head; curr; curr = curr->next)
	{
		if(TypeArray *typeArray = getType<TypeArray>(curr->type))
		{
			if(typeArray->length == length)
				return typeArray;
		}
	}

	assert(type->size < 64 * 1024);

	// Create new type
	TypeArray* result = new (get<TypeArray>()) TypeArray(GetArrayTypeName(*this, type, length), type, length);

	result->alignment = type->alignment;

	unsigned maximumAlignment = result->alignment < 4 ? 4 : result->alignment;

	if(result->size % maximumAlignment != 0)
	{
		result->padding = maximumAlignment - (result->size % maximumAlignment);
		result->size += result->padding;
	}

	// Save it for future use
	type->arrayTypes.push_back(new (get<TypeHandle>()) TypeHandle(result));

	types.push_back(result);

	return result;
}